

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  int key;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *puVar4;
  uint32 uVar5;
  FieldDescriptor *field;
  ulong uVar6;
  long *plVar7;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    field = Descriptor::FindFieldByNumber(this->descriptor_,key);
    uVar6 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar6 & 1) != 0) {
      uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar6 == 0) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_38,&local_40);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        plVar7 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 8))();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) ==
               9) {
        this_00 = &this->schema_;
        plVar7 = (long *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
        puVar2 = (undefined8 *)*plVar7;
        lVar3 = *(long *)(field + 0x58);
        if (lVar3 == 0) {
          if ((this->schema_).has_bits_offset_ != -1) {
            uVar5 = internal::ReflectionSchema::HasBitIndex(this_00,field);
            puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                             (ulong)(uVar5 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_
                             );
            *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
          }
        }
        else {
          *(undefined4 *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                         -0x55555554 + (this->schema_).oneof_case_offset_)) =
               *(undefined4 *)(field + 0x44);
        }
        uVar5 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
        uVar6 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                          (ulong)(uint)(this->schema_).metadata_offset_);
        if ((uVar6 & 1) != 0) {
          uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 0x18);
        }
        if ((uVar6 == 0) &&
           (puVar4 = *(undefined8 **)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
           puVar4 != (undefined8 *)0x0 && puVar4 != puVar2)) {
          if ((undefined8 *)*puVar4 != puVar4 + 2) {
            operator_delete((undefined8 *)*puVar4);
          }
          operator_delete(puVar4);
        }
      }
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}